

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::SubdivMeshNode::print(SubdivMeshNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(cout,"SubdivMeshNode @ ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," { closed = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," }");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SceneGraph::SubdivMeshNode::print(std::ostream& cout, int depth) {
    cout << "SubdivMeshNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }